

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_list.cpp
# Opt level: O3

RK_S32 __thiscall mpp_list::fifo_wr(mpp_list *this,void *data,RK_S32 size)

{
  mpp_list_node *pmVar1;
  mpp_list_node *pmVar2;
  RK_S32 RVar3;
  mpp_list_node *pmVar4;
  
  pmVar1 = this->head;
  if (pmVar1 == (mpp_list_node *)0x0) {
    RVar3 = -0x16;
  }
  else {
    pmVar4 = (mpp_list_node *)malloc((long)size + 0x1c);
    if (pmVar4 == (mpp_list_node *)0x0) {
      _mpp_log_l(2,"mpp_list","failed to allocate list node",(char *)0x0);
      RVar3 = -0xc;
    }
    else {
      pmVar4->key = 0;
      pmVar4->size = size;
      *(RK_S32 *)&pmVar4[1].prev = size;
      memcpy((void *)((long)&pmVar4[1].prev + 4),data,(long)size);
      pmVar2 = pmVar1->prev;
      pmVar1->prev = pmVar4;
      pmVar4->next = pmVar1;
      pmVar4->prev = pmVar2;
      pmVar2->next = pmVar4;
      this->count = this->count + 1;
      RVar3 = 0;
    }
  }
  return RVar3;
}

Assistant:

RK_S32 mpp_list::fifo_wr(void *data, RK_S32 size)
{
    RK_S32 ret = -EINVAL;
    if (head) {
        mpp_list_node *node = create_list_with_size(data, size, 0);
        if (node) {
            mpp_list_add_tail(node, head);
            count++;
            ret = 0;
        } else {
            ret = -ENOMEM;
        }
    }
    return ret;
}